

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_templates.h
# Opt level: O3

void __thiscall UniqueList<secplane_t>::Clear(UniqueList<secplane_t> *this)

{
  uint uVar1;
  ulong uVar2;
  
  if ((this->Array).Count != 0) {
    uVar2 = 0;
    do {
      operator_delete((this->Array).Array[uVar2],0x28);
      uVar2 = uVar2 + 1;
      uVar1 = (this->Array).Count;
    } while (uVar2 < uVar1);
    if (uVar1 != 0) {
      (this->Array).Count = 0;
    }
  }
  return;
}

Assistant:

void Clear()
	{
		for(unsigned i=0;i<Array.Size();i++) TheFreeList.Release(Array[i]);
		Array.Clear();
	}